

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  pointer ppFVar1;
  FieldDescriptor *field_00;
  ulong uVar2;
  bool bVar3;
  CppType CVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  FieldGenerator *pFVar7;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  int i;
  ulong uVar8;
  int iVar9;
  reference rVar10;
  long lStack_100;
  FieldDescriptor *field;
  FieldDescriptor *last_start;
  FieldGeneratorMap *local_d8;
  Printer *local_d0;
  string pod_template;
  string first_field_name;
  string last_field_name;
  RunMap runs;
  
  last_start = (FieldDescriptor *)0x0;
  uVar8 = 0;
  local_d0 = printer;
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&runs,0,(hash<const_google::protobuf::FieldDescriptor_*> *)&pod_template,
               (key_equal *)&first_field_name,(allocator_type *)&last_field_name);
  do {
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar8) {
      pod_template._M_dataplus._M_p = (pointer)&pod_template.field_2;
      pod_template._M_string_length = 0;
      pod_template.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)&pod_template);
      local_d8 = &this->field_generators_;
      for (iVar9 = 0; uVar8 = (ulong)iVar9,
          uVar8 < (ulong)((long)(this->optimized_order_).
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->optimized_order_).
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); iVar9 = iVar9 + 1)
      {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](processed,uVar8);
        if ((*rVar10._M_p & rVar10._M_mask) == 0) {
          field = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8];
          iVar6 = std::
                  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&runs,&field);
          if ((iVar6.
               super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
               ._M_cur == (__node_type *)0x0) ||
             (uVar2 = *(ulong *)((long)iVar6.
                                       super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_true>
                                       ._M_cur + 0x10), uVar2 < 2)) {
            if (copy_constructor) {
              pFVar7 = FieldGeneratorMap::get(local_d8,field);
              lStack_100 = 0x60;
            }
            else {
              pFVar7 = FieldGeneratorMap::get(local_d8,field);
              lStack_100 = 0x70;
            }
            (**(code **)((long)pFVar7->_vptr_FieldGenerator + lStack_100))(pFVar7,local_d0);
          }
          else {
            FieldName_abi_cxx11_(&first_field_name,(cpp *)field,field_01);
            FieldName_abi_cxx11_
                      (&last_field_name,
                       (cpp *)(this->optimized_order_).
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar2 + (uVar8 - 1)],
                       field_02);
            io::Printer::Print(local_d0,pod_template._M_dataplus._M_p,"first",&first_field_name,
                               "last",&last_field_name);
            iVar9 = iVar9 + (int)uVar2 + -1;
            std::__cxx11::string::~string((string *)&last_field_name);
            std::__cxx11::string::~string((string *)&first_field_name);
          }
        }
      }
      std::__cxx11::string::~string((string *)&pod_template);
      std::
      _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&runs);
      return;
    }
    field_00 = ppFVar1[uVar8];
    if (copy_constructor) {
      bVar3 = anon_unknown_0::IsPOD(field_00);
      if (!bVar3) goto LAB_00280926;
LAB_002808f5:
      if (last_start == (FieldDescriptor *)0x0) {
        last_start = field_00;
      }
      pmVar5 = std::__detail::
               _Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&runs,&last_start);
      *pmVar5 = *pmVar5 + 1;
    }
    else {
      bVar3 = anon_unknown_0::CanInitializeByZeroing(field_00);
      if ((bVar3) ||
         ((*(int *)(field_00 + 0x4c) != 3 &&
          (CVar4 = FieldDescriptor::cpp_type(field_00), CVar4 == CPPTYPE_MESSAGE))))
      goto LAB_002808f5;
LAB_00280926:
      last_start = (FieldDescriptor *)0x0;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  const FieldDescriptor* last_start = NULL;
  // RunMap maps from fields that start each run to the number of fields in that
  // run.  This is optimized for the common case that there are very few runs in
  // a message and that most of the eligible fields appear together.
  typedef hash_map<const FieldDescriptor*, size_t> RunMap;
  RunMap runs;

  for (int i = 0; i < optimized_order_.size(); ++i) {
    const FieldDescriptor* field = optimized_order_[i];
    if ((copy_constructor && IsPOD(field)) ||
        (!copy_constructor && CanConstructByZeroing(field, options_))) {
      if (last_start == NULL) {
        last_start = field;
      }

      runs[last_start]++;
    } else {
      last_start = NULL;
    }
  }

  string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    RunMap::const_iterator it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const string first_field_name = FieldName(field);
      const string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      printer->Print(pod_template.c_str(),
        "first", first_field_name,
        "last", last_field_name);

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}